

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

ActivationParametricSoftplus * __thiscall
CoreML::Specification::ActivationParametricSoftplus::New
          (ActivationParametricSoftplus *this,Arena *arena)

{
  ActivationParametricSoftplus *this_00;
  ActivationParametricSoftplus *n;
  Arena *arena_local;
  ActivationParametricSoftplus *this_local;
  
  this_00 = (ActivationParametricSoftplus *)operator_new(0x28);
  ActivationParametricSoftplus(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationParametricSoftplus>(arena,this_00)
    ;
  }
  return this_00;
}

Assistant:

ActivationParametricSoftplus* ActivationParametricSoftplus::New(::google::protobuf::Arena* arena) const {
  ActivationParametricSoftplus* n = new ActivationParametricSoftplus;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}